

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateUnaryOp(ExpressionTranslateContext *ctx,ExprUnaryOp *expression)

{
  ExprUnaryOp *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  switch(*(undefined4 *)&(expression->super_ExprBase).field_0x2c) {
  case 1:
    Print(ctx,"+(");
    break;
  case 2:
    Print(ctx,"-(");
    break;
  case 3:
    Print(ctx,"~(");
    break;
  case 4:
    Print(ctx,"!(");
    break;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                  ,0x2e8,"void TranslateUnaryOp(ExpressionTranslateContext &, ExprUnaryOp *)");
  }
  Translate(ctx,expression->value);
  Print(ctx,")");
  return;
}

Assistant:

void TranslateUnaryOp(ExpressionTranslateContext &ctx, ExprUnaryOp *expression)
{
	switch(expression->op)
	{
	case SYN_UNARY_OP_PLUS:
		Print(ctx, "+(");
		break;
	case SYN_UNARY_OP_NEGATE:
		Print(ctx, "-(");
		break;
	case SYN_UNARY_OP_BIT_NOT:
		Print(ctx, "~(");
		break;
	case SYN_UNARY_OP_LOGICAL_NOT:
		Print(ctx, "!(");
		break;
	default:
		assert(!"unknown type");
	}

	Translate(ctx, expression->value);
	Print(ctx, ")");
}